

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

Self * __thiscall
draco::PointAttributeVectorOutputIterator<unsigned_int>::operator=
          (PointAttributeVectorOutputIterator<unsigned_int> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  uint uVar1;
  PointAttribute *pPVar2;
  size_t sVar3;
  uint32_t index;
  ulong uVar4;
  pointer ptVar5;
  ulong uVar6;
  uint8_t *__dest;
  ulong uVar7;
  pointer __src;
  
  uVar6 = 0;
  while( true ) {
    ptVar5 = (this->attributes_).
             super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->attributes_).
                       super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar5) / 0x18) <= uVar6)
    {
      return this;
    }
    pPVar2 = ptVar5[uVar6].
             super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
             .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    uVar7 = (ulong)(this->point_id_).value_;
    if (pPVar2->identity_mapping_ == false) {
      uVar7 = (ulong)*(uint *)(*(long *)&(pPVar2->indices_map_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                         ._M_impl + uVar7 * 4);
    }
    if (pPVar2->num_unique_entries_ <= (uint)uVar7) break;
    ptVar5 = ptVar5 + uVar6;
    uVar1 = ((_Head_base<3UL,_unsigned_int,_false> *)
            ((long)&(ptVar5->
                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                    ).
                    super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                    .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int> + 4))->
            _M_head_impl;
    sVar3 = (size_t)uVar1;
    __src = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start +
            (ptVar5->
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
            ).super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
    if (uVar1 < 4) {
      __dest = this->data_;
      for (uVar4 = 0;
          uVar4 < *(uint *)&(ptVar5->
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                            ).
                            super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                            .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>;
          uVar4 = uVar4 + 1) {
        memcpy(__dest,__src + uVar4,sVar3);
        sVar3 = (size_t)((_Head_base<3UL,_unsigned_int,_false> *)
                        ((long)&(ptVar5->
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                                ).
                                super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                                .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>
                        + 4))->_M_head_impl;
        __dest = __dest + sVar3;
      }
      __src = (pointer)this->data_;
    }
    sVar3 = (pPVar2->super_GeometryAttribute).byte_stride_;
    memcpy((void *)(uVar7 * sVar3 + *(long *)&((pPVar2->super_GeometryAttribute).buffer_)->data_),
           __src,sVar3);
    uVar6 = uVar6 + 1;
  }
  return this;
}

Assistant:

const Self &operator=(const std::vector<CoeffT> &val) {
    for (auto index = 0; index < attributes_.size(); index++) {
      AttributeTuple &att = attributes_[index];
      PointAttribute *attribute = std::get<0>(att);
      const AttributeValueIndex avi = attribute->mapped_index(point_id_);
      if (avi >= static_cast<uint32_t>(attribute->size())) {
        return *this;
      }
      const uint32_t &offset = std::get<1>(att);
      const uint32_t &data_size = std::get<3>(att);
      const uint32_t &num_components = std::get<4>(att);
      const uint32_t *data_source = val.data() + offset;
      if (data_size < 4) {  // handle uint16_t, uint8_t
        // selectively copy data bytes
        uint8_t *data_counter = data_;
        for (uint32_t index = 0; index < num_components;
             index += 1, data_counter += data_size) {
          std::memcpy(data_counter, data_source + index, data_size);
        }
        // redirect to copied data
        data_source = reinterpret_cast<uint32_t *>(data_);
      }
      attribute->SetAttributeValue(avi, data_source);
    }
    return *this;
  }